

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int glfwInit(void)

{
  char *string;
  int iVar1;
  GLFWbool GVar2;
  int iVar3;
  char **ppcVar4;
  
  if (_glfw.initialized == 0) {
    iVar3 = 0;
    memset(&_glfw,0,0x20980);
    _glfw.hints.init.hatButtons = _glfwInitHints.hatButtons;
    _glfw.hints.init.ns.menubar = _glfwInitHints.ns.menubar;
    _glfw.hints.init.ns.chdir = _glfwInitHints.ns.chdir;
    iVar1 = _glfwPlatformInit();
    if (iVar1 == 0) {
      terminate();
    }
    else {
      GVar2 = _glfwPlatformCreateMutex(&_glfw.errorLock);
      if (((GVar2 != 0) && (GVar2 = _glfwPlatformCreateTls(&_glfw.errorSlot), GVar2 != 0)) &&
         (GVar2 = _glfwPlatformCreateTls(&_glfw.contextSlot), GVar2 != 0)) {
        _glfwPlatformSetTls(&_glfw.errorSlot,&_glfwMainThreadError);
        _glfw.initialized = 1;
        _glfw.timer.offset = _glfwPlatformGetTimerValue();
        glfwDefaultWindowHints();
        ppcVar4 = _glfwDefaultMappings;
        do {
          string = *ppcVar4;
          if (string == (char *)0x0) goto LAB_00145476;
          iVar3 = glfwUpdateGamepadMappings(string);
          ppcVar4 = ppcVar4 + 1;
        } while (iVar3 != 0);
        terminate();
LAB_00145476:
        return (uint)(string == (char *)0x0);
      }
      terminate();
      iVar3 = 0;
    }
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfw.initialized)
        return GLFW_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));
    _glfw.hints.init = _glfwInitHints;

    if (!_glfwPlatformInit())
    {
        terminate();
        return GLFW_FALSE;
    }

    if (!_glfwPlatformCreateMutex(&_glfw.errorLock) ||
        !_glfwPlatformCreateTls(&_glfw.errorSlot) ||
        !_glfwPlatformCreateTls(&_glfw.contextSlot))
    {
        terminate();
        return GLFW_FALSE;
    }

    _glfwPlatformSetTls(&_glfw.errorSlot, &_glfwMainThreadError);

    _glfw.initialized = GLFW_TRUE;
    _glfw.timer.offset = _glfwPlatformGetTimerValue();

    glfwDefaultWindowHints();

    {
        int i;

        for (i = 0;  _glfwDefaultMappings[i];  i++)
        {
            if (!glfwUpdateGamepadMappings(_glfwDefaultMappings[i]))
            {
                terminate();
                return GLFW_FALSE;
            }
        }
    }

    return GLFW_TRUE;
}